

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

void __thiscall
slang::ast::ProceduralCheckerStatement::serializeTo
          (ProceduralCheckerStatement *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppSVar2;
  Symbol *value;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "instances";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->instances)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppSVar2 = (this->instances)._M_ptr;
    lVar3 = 0;
    do {
      value = *(Symbol **)((long)ppSVar2 + lVar3);
      ASTSerializer::startObject(serializer);
      name_00._M_str = "instance";
      name_00._M_len = 8;
      ASTSerializer::writeLink(serializer,name_00,value);
      ASTSerializer::endObject(serializer);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void ProceduralCheckerStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("instances");
    for (auto inst : instances) {
        serializer.startObject();
        serializer.writeLink("instance", *inst);
        serializer.endObject();
    }
    serializer.endArray();
}